

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O3

csptr __thiscall pstack::Reader::view(Reader *this,string *name,Off offset,Off size)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  csptr cVar3;
  Off local_68;
  Off offset_local;
  Off size_local;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _func_int **local_48;
  element_type *peStack_40;
  undefined1 local_31;
  
  local_68 = size;
  std::__shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<pstack::Reader,void>
            ((__shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2> *)&size_local,
             (__weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)&name->_M_string_length);
  std::__shared_ptr<pstack::OffsetReader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::OffsetReader>,std::__cxx11::string_const&,std::shared_ptr<pstack::Reader_const>,unsigned_long&,unsigned_long&>
            ((__shared_ptr<pstack::OffsetReader,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (allocator<pstack::OffsetReader> *)&local_31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)offset,
             (shared_ptr<const_pstack::Reader> *)&size_local,&local_68,&offset_local);
  peVar1 = peStack_40;
  peStack_40 = (element_type *)0x0;
  this->_vptr_Reader = local_48;
  (this->super_enable_shared_from_this<pstack::Reader>)._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_48 = (_func_int **)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    _Var2._M_pi = extraout_RDX_00;
  }
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (csptr)cVar3.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
Reader::view(const std::string &name, Off offset, Off size) const {
   return std::make_shared<OffsetReader>(name, shared_from_this(), offset, size);
}